

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O3

void resampler_fill_and_remove_delay(resampler *r)

{
  float *__src;
  float *__dest;
  float *pfVar1;
  float *pfVar2;
  size_t sVar3;
  undefined8 uVar4;
  byte bVar5;
  anon_struct_8_2_f9ee98fb_for_bigint_1 aVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  float *in_;
  float *pfVar16;
  float *pfVar17;
  long lVar18;
  double *pdVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  unsigned_long_long uVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  float *pfVar31;
  ulong uVar32;
  float *out;
  float *pfVar33;
  bool bVar34;
  float fVar35;
  double dVar36;
  double dVar37;
  float fVar38;
  double dVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  double dVar43;
  undefined8 local_138;
  undefined8 uStack_130;
  float afStack_100 [48];
  double local_40 [2];
  
  iVar12 = resampler_has_sse;
  bVar5 = r->quality;
  iVar20 = 1;
  if ((byte)(bVar5 - 2) < 4) {
    iVar20 = *(int *)(&DAT_007a0a40 + (ulong)(byte)(bVar5 - 2) * 4);
  }
  uVar28 = r->write_filled;
  if (iVar20 < (int)uVar28) {
    __src = r->buffer_out;
    __dest = r->buffer_out + 0x40;
    iVar15 = r->read_filled;
    do {
      if (0x3f < iVar15) break;
      iVar14 = r->read_pos;
      uVar25 = iVar14 + iVar15;
      uVar30 = iVar14 + 0x3f + iVar15;
      if (-1 < (int)uVar25) {
        uVar30 = uVar25;
      }
      iVar26 = uVar25 - (uVar30 & 0xffffffc0);
      pfVar33 = __src + iVar26;
      if (iVar15 <= iVar26) {
        iVar15 = iVar26;
      }
      if (5 < bVar5) goto LAB_0071fbdf;
      uVar30 = 0x40 - iVar15;
      switch(bVar5) {
      case 0:
        if (1 < (int)uVar28) {
          pfVar31 = pfVar33 + uVar30;
          pfVar17 = (float *)((long)r + (long)(int)uVar28 * -4 + (long)r->write_pos * 4 + 0x148);
          uVar23 = (r->phase).quad;
          uVar24 = (r->phase_inc).quad;
          pfVar16 = pfVar17;
          do {
            if (pfVar31 <= pfVar33) break;
            *pfVar33 = *pfVar16;
            pfVar33 = pfVar33 + 1;
            uVar23 = uVar23 + uVar24;
            pfVar16 = pfVar16 + (uVar23 >> 0x20);
            uVar23 = uVar23 & 0xffffffff;
          } while (pfVar16 < pfVar17 + ((ulong)uVar28 - 1));
          (r->phase).quad = uVar23;
          iVar15 = (int)((ulong)((long)pfVar16 - (long)pfVar17) >> 2);
LAB_0071f0a3:
          uVar28 = uVar28 - iVar15;
LAB_0071fbd7:
          r->write_filled = uVar28;
        }
        break;
      case 1:
        iVar15 = 0x1f;
        if (iVar14 < 0x1f) {
          iVar15 = iVar14;
        }
        if (iVar26 < iVar14) {
          iVar15 = 0;
        }
        sVar3 = (long)iVar15 * 4;
        memcpy(__dest,__src,sVar3);
        pfVar16 = (float *)((long)r + (long)(int)uVar28 * -4 + (long)r->write_pos * 4 + 0x148);
        pfVar31 = pfVar33 + (ulong)uVar30 + (long)iVar15;
        if (iVar12 == 0) {
          if ((int)uVar28 < 2) goto LAB_0071fc00;
          dVar37 = r->last_amp;
          uVar23 = (r->inv_phase).quad;
          uVar24 = (r->inv_phase_inc).quad;
          pfVar17 = pfVar16;
          do {
            if (pfVar31 < pfVar33 + 0x20) break;
            fVar35 = *pfVar17;
            dVar39 = (double)fVar35 - dVar37;
            if (dVar39 != 0.0) {
              iVar14 = (int)(uVar23 >> 0x16);
              iVar13 = iVar14 * 0x399;
              iVar15 = iVar13 + 0x3ff;
              if (-1 < iVar13) {
                iVar15 = iVar13;
              }
              uVar30 = iVar14 - 0x4000;
              uVar25 = (iVar15 >> 10) - 0x3990;
              dVar43 = 0.0;
              iVar15 = 0x11;
              pdVar19 = local_40;
              do {
                uVar29 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar29 = uVar25;
                }
                uVar7 = -uVar30;
                if (0 < (int)uVar30) {
                  uVar7 = uVar30;
                }
                fVar38 = window_lut[uVar7];
                fVar40 = sinc_lut[uVar29];
                *pdVar19 = (double)(fVar38 * fVar40);
                dVar43 = dVar43 + (double)(fVar38 * fVar40);
                iVar15 = iVar15 + -1;
                pdVar19 = pdVar19 + -1;
                uVar30 = uVar30 + 0x400;
                uVar25 = uVar25 + 0x399;
              } while (-0xf < iVar15);
              lVar18 = 0;
              do {
                *(ulong *)(pfVar33 + lVar18) =
                     CONCAT44((float)((ulong)*(undefined8 *)(pfVar33 + lVar18) >> 0x20) +
                              (float)((double)(&uStack_130)[lVar18] * dVar39 * (1.0 / dVar43)),
                              (float)*(undefined8 *)(pfVar33 + lVar18) +
                              (float)((double)(&local_138)[lVar18] * dVar39 * (1.0 / dVar43)));
                lVar18 = lVar18 + 2;
                dVar37 = (double)fVar35;
              } while (lVar18 != 0x20);
            }
            pfVar17 = pfVar17 + 1;
            uVar23 = uVar23 + uVar24;
            pfVar33 = pfVar33 + (uVar23 >> 0x20);
            uVar23 = uVar23 & 0xffffffff;
          } while (pfVar17 < pfVar16 + ((ulong)uVar28 - 1));
          (r->inv_phase).quad = uVar23;
          r->last_amp = dVar37;
          iVar15 = (int)((ulong)((long)pfVar17 - (long)pfVar16) >> 2);
        }
        else {
          if ((int)uVar28 < 2) goto LAB_0071fc00;
          dVar37 = r->last_amp;
          uVar23 = (r->inv_phase).quad;
          uVar24 = (r->inv_phase_inc).quad;
          pfVar17 = pfVar16;
          do {
            if (pfVar31 < pfVar33 + 0x20) break;
            fVar35 = *pfVar17;
            dVar39 = (double)fVar35 - dVar37;
            if (dVar39 != 0.0) {
              iVar14 = (int)(uVar23 >> 0x16);
              iVar13 = iVar14 * 0x399;
              iVar15 = iVar13 + 0x3ff;
              if (-1 < iVar13) {
                iVar15 = iVar13;
              }
              uVar25 = (iVar15 >> 10) - 0x3990;
              uVar30 = iVar14 - 0x4000;
              fVar38 = 0.0;
              lVar18 = 0x11;
              do {
                uVar29 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar29 = uVar25;
                }
                uVar7 = -uVar30;
                if (0 < (int)uVar30) {
                  uVar7 = uVar30;
                }
                fVar40 = window_lut[uVar7];
                fVar41 = sinc_lut[uVar29];
                afStack_100[lVar18] = fVar40 * fVar41;
                fVar38 = fVar38 + fVar40 * fVar41;
                lVar18 = lVar18 + -1;
                uVar25 = uVar25 + 0x399;
                uVar30 = uVar30 + 0x400;
              } while (-0xf < lVar18);
              fVar38 = (float)(dVar39 / (double)fVar38);
              lVar18 = 0;
              do {
                fVar40 = *(float *)((long)&local_138 + lVar18 + 4);
                fVar41 = *(float *)((long)&uStack_130 + lVar18);
                fVar42 = *(float *)((long)&uStack_130 + lVar18 + 4);
                pfVar1 = (float *)((long)pfVar33 + lVar18);
                fVar9 = pfVar1[1];
                fVar10 = pfVar1[2];
                fVar11 = pfVar1[3];
                pfVar2 = (float *)((long)pfVar33 + lVar18);
                *pfVar2 = *pfVar1 + *(float *)((long)&local_138 + lVar18) * fVar38;
                pfVar2[1] = fVar9 + fVar40 * fVar38;
                pfVar2[2] = fVar10 + fVar41 * fVar38;
                pfVar2[3] = fVar11 + fVar42 * fVar38;
                lVar18 = lVar18 + 0x10;
                dVar37 = (double)fVar35;
              } while (lVar18 != 0x80);
            }
            pfVar17 = pfVar17 + 1;
            uVar23 = uVar23 + uVar24;
            pfVar33 = pfVar33 + (uVar23 >> 0x20);
            uVar23 = uVar23 & 0xffffffff;
          } while (pfVar17 < pfVar16 + ((ulong)uVar28 - 1));
          (r->inv_phase).quad = uVar23;
          r->last_amp = dVar37;
          iVar15 = (int)((ulong)((long)pfVar17 - (long)pfVar16) >> 2);
          uVar28 = r->write_filled;
        }
        uVar28 = uVar28 - iVar15;
        r->write_filled = uVar28;
        memcpy(__src,__dest,sVar3);
        bVar34 = iVar15 == 0;
        goto LAB_0071f8f3;
      case 2:
        if (2 < (int)uVar28) {
          pfVar31 = pfVar33 + uVar30;
          pfVar17 = (float *)((long)r + (long)(int)uVar28 * -4 + (long)r->write_pos * 4 + 0x148);
          uVar30 = (r->phase).field_1.lo;
          uVar25 = (r->phase).field_1.hi;
          aVar6 = (r->phase_inc).field_1;
          pfVar16 = pfVar17;
          do {
            if (pfVar31 <= pfVar33) goto LAB_0071f08f;
            *pfVar33 = (float)uVar30 * 2.3283064e-10 * (pfVar16[1] - *pfVar16) + *pfVar16;
            pfVar33 = pfVar33 + 1;
            lVar18 = (ulong)uVar30 + (long)aVar6;
            pfVar16 = pfVar16 + (uVar25 + (int)((ulong)lVar18 >> 0x20));
            uVar30 = uVar30 + aVar6.lo;
            uVar25 = 0;
          } while (pfVar16 < pfVar17 + ((ulong)uVar28 - 2));
          uVar30 = (uint)lVar18;
LAB_0071f08f:
          (r->phase).field_1.lo = uVar30;
          (r->phase).field_1.hi = uVar25;
          iVar15 = (int)((ulong)((long)pfVar16 - (long)pfVar17) >> 2);
          goto LAB_0071f0a3;
        }
        break;
      case 3:
        iVar15 = 0x1f;
        if (iVar14 < 0x1f) {
          iVar15 = iVar14;
        }
        if (iVar26 < iVar14) {
          iVar15 = 0;
        }
        sVar3 = (long)iVar15 * 4;
        memcpy(__dest,__src,sVar3);
        pfVar16 = (float *)((long)r + (long)(int)uVar28 * -4 + (long)r->write_pos * 4 + 0x148);
        pfVar31 = pfVar33;
        if (iVar12 == 0) {
          if ((int)uVar28 < 3) goto LAB_0071fc00;
          dVar37 = r->last_amp;
          uVar23 = (r->phase).quad;
          uVar27 = (r->phase_inc).quad;
          uVar24 = (r->inv_phase).quad;
          uVar21 = (r->inv_phase_inc).quad;
          pfVar17 = pfVar16;
          do {
            if (pfVar33 + (ulong)uVar30 + (long)iVar15 < pfVar31 + 0x20) break;
            dVar39 = (double)*pfVar17;
            if (uVar27 >> 0x20 == 0) {
              dVar39 = dVar39 + (double)((float)uVar23 * 2.3283064e-10 * (pfVar17[1] - *pfVar17));
            }
            dVar43 = dVar39 - dVar37;
            if (dVar43 != 0.0) {
              iVar22 = (int)(uVar24 >> 0x16);
              iVar13 = iVar22 * 0x3b8;
              iVar14 = iVar13 + 0x3ff;
              if (-1 < iVar13) {
                iVar14 = iVar13;
              }
              uVar29 = iVar22 - 0x4000;
              uVar25 = (iVar14 >> 10) - 0x3b80;
              dVar36 = 0.0;
              iVar14 = 0x11;
              pdVar19 = local_40;
              do {
                uVar7 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar7 = uVar25;
                }
                uVar8 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar8 = uVar29;
                }
                fVar35 = window_lut[uVar8];
                fVar38 = sinc_lut[uVar7];
                *pdVar19 = (double)(fVar35 * fVar38);
                dVar36 = dVar36 + (double)(fVar35 * fVar38);
                iVar14 = iVar14 + -1;
                pdVar19 = pdVar19 + -1;
                uVar29 = uVar29 + 0x400;
                uVar25 = uVar25 + 0x3b8;
              } while (-0xf < iVar14);
              lVar18 = 0;
              do {
                *(ulong *)(pfVar31 + lVar18) =
                     CONCAT44((float)((ulong)*(undefined8 *)(pfVar31 + lVar18) >> 0x20) +
                              (float)((double)(&uStack_130)[lVar18] * dVar43 * (1.0 / dVar36)),
                              (float)*(undefined8 *)(pfVar31 + lVar18) +
                              (float)((double)(&local_138)[lVar18] * dVar43 * (1.0 / dVar36)));
                lVar18 = lVar18 + 2;
                dVar37 = dVar39;
              } while (lVar18 != 0x20);
            }
            if (uVar21 >> 0x20 == 0) {
              pfVar17 = pfVar17 + 1;
              uVar32 = uVar24 + uVar21;
              pfVar31 = pfVar31 + (uVar32 >> 0x20);
              uVar24 = uVar32 & 0xffffffff;
            }
            else {
              uVar23 = uVar23 + uVar27;
              pfVar31 = pfVar31 + 1;
              pfVar17 = pfVar17 + (uVar23 >> 0x20);
              uVar23 = uVar23 & 0xffffffff;
            }
          } while (pfVar17 < pfVar16 + ((ulong)uVar28 - 2));
          (r->phase).quad = uVar23;
          (r->inv_phase).quad = uVar24;
          r->last_amp = dVar37;
          iVar15 = (int)((ulong)((long)pfVar17 - (long)pfVar16) >> 2);
        }
        else {
          if ((int)uVar28 < 3) goto LAB_0071fc00;
          dVar37 = r->last_amp;
          uVar23 = (r->phase).quad;
          uVar27 = (r->phase_inc).quad;
          uVar24 = (r->inv_phase).quad;
          uVar21 = (r->inv_phase_inc).quad;
          pfVar17 = pfVar16;
          do {
            if (pfVar33 + (ulong)uVar30 + (long)iVar15 < pfVar31 + 0x20) break;
            dVar39 = (double)*pfVar17;
            if (uVar27 >> 0x20 == 0) {
              dVar39 = dVar39 + (double)((float)uVar23 * 2.3283064e-10 * (pfVar17[1] - *pfVar17));
            }
            if (dVar39 - dVar37 != 0.0) {
              iVar22 = (int)(uVar24 >> 0x16);
              iVar13 = iVar22 * 0x3b8;
              iVar14 = iVar13 + 0x3ff;
              if (-1 < iVar13) {
                iVar14 = iVar13;
              }
              uVar29 = (iVar14 >> 10) - 0x3b80;
              uVar25 = iVar22 - 0x4000;
              fVar35 = 0.0;
              lVar18 = 0x11;
              do {
                uVar7 = -uVar29;
                if (0 < (int)uVar29) {
                  uVar7 = uVar29;
                }
                uVar8 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar8 = uVar25;
                }
                fVar38 = window_lut[uVar8];
                fVar40 = sinc_lut[uVar7];
                afStack_100[lVar18] = fVar38 * fVar40;
                fVar35 = fVar35 + fVar38 * fVar40;
                lVar18 = lVar18 + -1;
                uVar29 = uVar29 + 0x3b8;
                uVar25 = uVar25 + 0x400;
              } while (-0xf < lVar18);
              fVar35 = (float)((dVar39 - dVar37) / (double)fVar35);
              lVar18 = 0;
              do {
                fVar38 = *(float *)((long)&local_138 + lVar18 + 4);
                fVar40 = *(float *)((long)&uStack_130 + lVar18);
                fVar41 = *(float *)((long)&uStack_130 + lVar18 + 4);
                pfVar1 = (float *)((long)pfVar31 + lVar18);
                fVar42 = pfVar1[1];
                fVar9 = pfVar1[2];
                fVar10 = pfVar1[3];
                pfVar2 = (float *)((long)pfVar31 + lVar18);
                *pfVar2 = *pfVar1 + *(float *)((long)&local_138 + lVar18) * fVar35;
                pfVar2[1] = fVar42 + fVar38 * fVar35;
                pfVar2[2] = fVar9 + fVar40 * fVar35;
                pfVar2[3] = fVar10 + fVar41 * fVar35;
                lVar18 = lVar18 + 0x10;
                dVar37 = dVar39;
              } while (lVar18 != 0x80);
            }
            if (uVar21 >> 0x20 == 0) {
              pfVar17 = pfVar17 + 1;
              uVar32 = uVar24 + uVar21;
              pfVar31 = pfVar31 + (uVar32 >> 0x20);
              uVar24 = uVar32 & 0xffffffff;
            }
            else {
              uVar23 = uVar23 + uVar27;
              pfVar31 = pfVar31 + 1;
              if (uVar23 >> 0x20 != 0) {
                pfVar17 = pfVar17 + 1;
                uVar23 = uVar23 & 0xffffffff;
              }
            }
          } while (pfVar17 < pfVar16 + ((ulong)uVar28 - 2));
          (r->phase).quad = uVar23;
          (r->inv_phase).quad = uVar24;
          r->last_amp = dVar37;
          iVar15 = (int)((ulong)((long)pfVar17 - (long)pfVar16) >> 2);
          uVar28 = r->write_filled;
        }
        uVar28 = uVar28 - iVar15;
        r->write_filled = uVar28;
        memcpy(__src,__dest,sVar3);
        bVar34 = pfVar31 == pfVar33;
        pfVar33 = pfVar31;
LAB_0071f8f3:
        if (bVar34) goto LAB_0071fc00;
        break;
      case 4:
        pfVar16 = (float *)((long)r + (long)(int)uVar28 * -4 + (long)r->write_pos * 4 + 0x148);
        pfVar31 = pfVar33 + uVar30;
        if (iVar12 == 0) {
          if (4 < (int)uVar28) {
            uVar23 = (r->phase).quad;
            uVar24 = (r->phase_inc).quad;
            pfVar17 = pfVar16;
            do {
              if (pfVar31 <= pfVar33) break;
              uVar27 = (long)(int)(uVar23 >> 0x14) & 0xfffffffffffffffc;
              *pfVar33 = pfVar17[3] * cubic_lut[uVar27 + 3] + pfVar17[1] * cubic_lut[uVar27 + 1] +
                         pfVar17[2] * cubic_lut[uVar27 + 2] + *pfVar17 * cubic_lut[uVar27];
              pfVar33 = pfVar33 + 1;
              uVar23 = uVar23 + uVar24;
              pfVar17 = pfVar17 + (uVar23 >> 0x20);
              uVar23 = uVar23 & 0xffffffff;
            } while (pfVar17 < pfVar16 + ((ulong)uVar28 - 4));
            (r->phase).quad = uVar23;
            iVar15 = (int)((ulong)((long)pfVar17 - (long)pfVar16) >> 2);
            goto LAB_0071f567;
          }
        }
        else if (4 < (int)uVar28) {
          uVar23 = (r->phase).quad;
          uVar24 = (r->phase_inc).quad;
          pfVar17 = pfVar16;
          do {
            if (pfVar31 <= pfVar33) break;
            uVar27 = (long)(int)(uVar23 >> 0x14) & 0xfffffffffffffffc;
            *pfVar33 = pfVar17[3] * cubic_lut[uVar27 + 3] + pfVar17[1] * cubic_lut[uVar27 + 1] +
                       pfVar17[2] * cubic_lut[uVar27 + 2] + *pfVar17 * cubic_lut[uVar27];
            pfVar33 = pfVar33 + 1;
            uVar23 = uVar23 + uVar24;
            pfVar17 = pfVar17 + (uVar23 >> 0x20);
            uVar23 = uVar23 & 0xffffffff;
          } while (pfVar17 < pfVar16 + ((ulong)uVar28 - 4));
          (r->phase).quad = uVar23;
          iVar15 = (int)((ulong)((long)pfVar17 - (long)pfVar16) >> 2);
          uVar28 = r->write_filled;
LAB_0071f567:
          uVar28 = uVar28 - iVar15;
          goto LAB_0071fbd7;
        }
        break;
      case 5:
        uVar23 = (long)r + (long)(int)uVar28 * -4 + (long)r->write_pos * 4 + 0x148;
        pfVar31 = pfVar33 + uVar30;
        if (iVar12 == 0) {
          if (0x20 < (int)uVar28) {
            uVar27 = (r->phase_inc).quad;
            uVar21 = (r->phase).quad;
            iVar15 = (int)(4.3936485e+12 / (float)uVar27);
            if (uVar27 < 0x100000001) {
              iVar15 = 0x3fe;
            }
            uVar32 = uVar23;
            do {
              iVar22 = (int)(uVar21 >> 0x16);
              iVar13 = iVar15 * iVar22;
              iVar14 = iVar13 + 0x3ff;
              if (-1 < iVar13) {
                iVar14 = iVar13;
              }
              if (pfVar31 <= pfVar33) break;
              uVar25 = (iVar14 >> 10) + iVar15 * -0x10;
              uVar30 = iVar22 - 0x4000;
              dVar37 = 0.0;
              iVar14 = 0x11;
              pdVar19 = local_40;
              do {
                uVar29 = -uVar25;
                if (0 < (int)uVar25) {
                  uVar29 = uVar25;
                }
                uVar7 = -uVar30;
                if (0 < (int)uVar30) {
                  uVar7 = uVar30;
                }
                fVar35 = window_lut[uVar7];
                fVar38 = sinc_lut[uVar29];
                *pdVar19 = (double)(fVar35 * fVar38);
                dVar37 = dVar37 + (double)(fVar35 * fVar38);
                iVar14 = iVar14 + -1;
                pdVar19 = pdVar19 + -1;
                uVar30 = uVar30 + 0x400;
                uVar25 = uVar25 + iVar15;
              } while (-0xf < iVar14);
              fVar35 = 0.0;
              fVar38 = 0.0;
              lVar18 = 0;
              do {
                uVar4 = *(undefined8 *)(uVar32 + lVar18 * 4);
                fVar35 = fVar35 + (float)((double)(float)uVar4 * (double)(&local_138)[lVar18]);
                fVar38 = fVar38 + (float)((double)(float)((ulong)uVar4 >> 0x20) *
                                         (double)(&uStack_130)[lVar18]);
                lVar18 = lVar18 + 2;
              } while (lVar18 != 0x20);
              *pfVar33 = (float)((double)(fVar38 + fVar35) / dVar37);
              pfVar33 = pfVar33 + 1;
              uVar32 = uVar32 + (uVar21 + uVar27 >> 0x20) * 4;
              uVar21 = uVar21 + uVar27 & 0xffffffff;
            } while (uVar32 < uVar23 + ((ulong)uVar28 - 0x20) * 4);
            (r->phase).quad = uVar21;
            iVar15 = (int)(uVar32 - uVar23 >> 2);
            goto LAB_0071fbd4;
          }
        }
        else if (0x20 < (int)uVar28) {
          uVar27 = (r->phase_inc).quad;
          uVar21 = (r->phase).quad;
          iVar15 = (int)(4.3936485e+12 / (float)uVar27);
          if (uVar27 < 0x100000001) {
            iVar15 = 0x3fe;
          }
          uVar32 = uVar23;
          do {
            if (pfVar31 <= pfVar33) break;
            iVar22 = (int)(uVar21 >> 0x16);
            iVar13 = iVar15 * iVar22;
            iVar14 = iVar13 + 0x3ff;
            if (-1 < iVar13) {
              iVar14 = iVar13;
            }
            uVar25 = (iVar14 >> 10) + iVar15 * -0x10;
            uVar30 = iVar22 - 0x4000;
            fVar35 = 0.0;
            lVar18 = 0x11;
            do {
              uVar29 = -uVar25;
              if (0 < (int)uVar25) {
                uVar29 = uVar25;
              }
              uVar7 = -uVar30;
              if (0 < (int)uVar30) {
                uVar7 = uVar30;
              }
              fVar38 = window_lut[uVar7];
              fVar40 = sinc_lut[uVar29];
              afStack_100[lVar18] = fVar38 * fVar40;
              fVar35 = fVar35 + fVar38 * fVar40;
              lVar18 = lVar18 + -1;
              uVar25 = uVar25 + iVar15;
              uVar30 = uVar30 + 0x400;
            } while (-0xf < lVar18);
            fVar38 = 0.0;
            fVar40 = 0.0;
            fVar41 = 0.0;
            fVar42 = 0.0;
            lVar18 = 0;
            do {
              pfVar16 = (float *)(uVar32 + lVar18);
              fVar38 = fVar38 + *pfVar16 * *(float *)((long)&local_138 + lVar18);
              fVar40 = fVar40 + pfVar16[1] * *(float *)((long)&local_138 + lVar18 + 4);
              fVar41 = fVar41 + pfVar16[2] * *(float *)((long)&uStack_130 + lVar18);
              fVar42 = fVar42 + pfVar16[3] * *(float *)((long)&uStack_130 + lVar18 + 4);
              lVar18 = lVar18 + 0x10;
            } while (lVar18 != 0x80);
            *pfVar33 = (fVar42 + fVar40 + fVar41 + fVar38) / fVar35;
            pfVar33 = pfVar33 + 1;
            uVar32 = uVar32 + (uVar21 + uVar27 >> 0x20) * 4;
            uVar21 = uVar21 + uVar27 & 0xffffffff;
          } while (uVar32 < uVar23 + ((ulong)uVar28 - 0x20) * 4);
          (r->phase).quad = uVar21;
          iVar15 = (int)(uVar32 - uVar23 >> 2);
          uVar28 = r->write_filled;
LAB_0071fbd4:
          uVar28 = uVar28 - iVar15;
          goto LAB_0071fbd7;
        }
      }
LAB_0071fbdf:
      iVar15 = (r->read_filled - iVar26) + (int)((ulong)((long)pfVar33 - (long)__src) >> 2);
      r->read_filled = iVar15;
    } while (iVar20 < (int)uVar28);
  }
LAB_0071fc00:
  if ((r->delay_removed < '\0') && (r->delay_removed = '\0', (r->quality - 1 & 0xfd) == 0)) {
    iVar20 = -0xf;
    do {
      resampler_remove_sample(r,1);
      iVar20 = iVar20 + 1;
    } while (iVar20 != 0);
  }
  return;
}

Assistant:

static void resampler_fill_and_remove_delay(resampler * r)
{
    resampler_fill( r );
    if ( r->delay_removed < 0 )
    {
        int delay = resampler_output_delay( r );
        r->delay_removed = 0;
        while ( delay-- )
            resampler_remove_sample( r, 1 );
    }
}